

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,color4d *value)

{
  bool bVar1;
  reference pvVar2;
  undefined1 local_40 [8];
  double4 v;
  color4d *value_local;
  AsciiParser *this_local;
  
  v._M_elems[3] = (double)value;
  bVar1 = ParseBasicTypeTuple<double,4ul>(this,(array<double,_4UL> *)local_40);
  if (bVar1) {
    pvVar2 = ::std::array<double,_4UL>::operator[]((array<double,_4UL> *)local_40,0);
    *(value_type_conflict4 *)v._M_elems[3] = *pvVar2;
    pvVar2 = ::std::array<double,_4UL>::operator[]((array<double,_4UL> *)local_40,1);
    *(value_type_conflict4 *)((long)v._M_elems[3] + 8) = *pvVar2;
    pvVar2 = ::std::array<double,_4UL>::operator[]((array<double,_4UL> *)local_40,2);
    *(value_type_conflict4 *)((long)v._M_elems[3] + 0x10) = *pvVar2;
    pvVar2 = ::std::array<double,_4UL>::operator[]((array<double,_4UL> *)local_40,3);
    *(value_type_conflict4 *)((long)v._M_elems[3] + 0x18) = *pvVar2;
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::color4d *value) {
  value::double4 v;
  if (ParseBasicTypeTuple(&v)) {
    value->r = v[0];
    value->g = v[1];
    value->b = v[2];
    value->a = v[3];
    return true;
  }
  return false;
}